

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O1

void __thiscall dg::vr::ValueRelations::erasePlaceholderBucket(ValueRelations *this,Handle h)

{
  ValToBucket *this_00;
  BucketToVals *this_01;
  _Base_ptr p_Var1;
  iterator iVar2;
  _Base_ptr p_Var3;
  pair<std::_Rb_tree_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>,_std::_Rb_tree_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
  pVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
  pVar5;
  V val;
  key_type local_40;
  ValueRelations *local_38;
  
  this_01 = &this->bucketToVals;
  local_40._M_data = h;
  local_38 = this;
  iVar2 = std::
          _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
          ::find(&this_01->_M_t,&local_40);
  p_Var3 = iVar2._M_node[1]._M_parent;
  p_Var1 = iVar2._M_node[1]._M_left;
  if (p_Var3 != p_Var1) {
    this_00 = &local_38->valToBucket;
    do {
      local_40._M_data = *(Bucket **)p_Var3;
      pVar4 = std::
              _Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::_Select1st<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
              ::equal_range(&this_00->_M_t,(key_type *)&local_40);
      std::
      _Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::_Select1st<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
      p_Var3 = (_Base_ptr)&p_Var3->_M_parent;
    } while (p_Var3 != p_Var1);
  }
  local_40._M_data = h;
  pVar5 = std::
          _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
          ::equal_range(&this_01->_M_t,&local_40);
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
  ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
  RelationsGraph<dg::vr::ValueRelations>::erase(&local_38->graph,h);
  return;
}

Assistant:

void ValueRelations::erasePlaceholderBucket(Handle h) {
    auto found = bucketToVals.find(h);
    assert(found != bucketToVals.end());
    for (V val : found->second) {
        assert(valToBucket.find(val) != valToBucket.end() &&
               valToBucket.at(val) == h);
        valToBucket.erase(val);
    }
    bucketToVals.erase(h);
    graph.erase(h);
}